

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O1

void __thiscall cube::net::TcpConnection::CloseAfter(TcpConnection *this,int64_t delay_ms)

{
  EventLoop *this_00;
  native_handle_type nVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pthread_t pVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = this->m_event_loop;
  nVar1 = (this_00->m_thread_id)._M_thread;
  pVar4 = pthread_self();
  if (nVar1 == pVar4) {
    std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cube::net::TcpConnection,void>
              ((__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               (__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    p_Var3 = p_Stack_60;
    uVar2 = local_68;
    local_68 = 0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = operator_new(0x20);
    *(code **)local_58._M_unused._0_8_ = Close;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = uVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x18) =
         p_Var3;
    pcStack_40 = std::
                 _Function_handler<void_(),_std::_Bind<void_(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()>_>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_std::_Bind<void_(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()>_>
               ::_M_manager;
    EventLoop::RunAfter(this_00,(Task *)&local_58,delay_ms);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    return;
  }
  abort();
}

Assistant:

void TcpConnection::CloseAfter(int64_t delay_ms) {
    m_event_loop->AssertInLoopThread();
    m_event_loop->RunAfter(std::bind(&TcpConnection::Close, shared_from_this()), delay_ms);
}